

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O2

disk_io_thread_pool * __thiscall
libtorrent::mmap_disk_io::pool_for_job(mmap_disk_io *this,mmap_disk_job *j)

{
  if ((0 < (this->m_hash_threads).m_max_threads.super___atomic_base<int>._M_i) &&
     ((*(__index_type *)
        ((long)&(j->super_disk_job).action.
                super__Variant_base<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                .
                super__Move_assign_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                .
                super__Copy_assign_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                .
                super__Move_ctor_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                .
                super__Copy_ctor_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
        + 0x50) & 0xfe) == 2)) {
    return &this->m_hash_threads;
  }
  return &this->m_generic_threads;
}

Assistant:

aux::disk_io_thread_pool& mmap_disk_io::pool_for_job(aux::mmap_disk_job* j)
	{
		if (m_hash_threads.max_threads() > 0
			&& (j->get_type() == aux::job_action_t::hash
				|| j->get_type() == aux::job_action_t::hash2))
			return m_hash_threads;
		else
			return m_generic_threads;
	}